

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O1

void lws_x509_destroy(lws_x509_cert **x509)

{
  X509 *a;
  
  if (*x509 != (lws_x509_cert *)0x0) {
    a = (X509 *)(*x509)->cert;
    if (a != (X509 *)0x0) {
      X509_free(a);
      (*x509)->cert = (X509 *)0x0;
    }
    lws_realloc(*x509,0,"free");
    *x509 = (lws_x509_cert *)0x0;
  }
  return;
}

Assistant:

void
lws_x509_destroy(struct lws_x509_cert **x509)
{
	if (!*x509)
		return;

	if ((*x509)->cert) {
		X509_free((*x509)->cert);
		(*x509)->cert = NULL;
	}

	lws_free_set_NULL(*x509);
}